

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_CutComputeTruth(Lf_Man_t *p,Lf_Cut_t *pCut0,Lf_Cut_t *pCut1,int fCompl0,int fCompl1,
                      Lf_Cut_t *pCutR,int fIsXor)

{
  uint uVar1;
  int nWords_00;
  uint uVar2;
  int iVar3;
  word *pIn;
  word *pIn_00;
  word *pTruth1;
  word *pTruth0;
  uint local_648;
  int nWords;
  int fCompl;
  int LutSize;
  int truthId;
  int nOldSupp;
  word uTruth1 [64];
  word uTruth0 [64];
  word uTruth [64];
  Lf_Cut_t *pCutR_local;
  int fCompl1_local;
  int fCompl0_local;
  Lf_Cut_t *pCut1_local;
  Lf_Cut_t *pCut0_local;
  Lf_Man_t *p_local;
  
  if (p->pPars->nLutSize < 7) {
    p_local._4_4_ = Lf_CutComputeTruth6(p,pCut0,pCut1,fCompl0,fCompl1,pCutR,fIsXor);
  }
  else {
    uVar1 = *(uint *)&pCutR->field_0x14 >> 0x18;
    iVar3 = p->pPars->nLutSize;
    nWords_00 = Abc_Truth6WordNum(iVar3);
    pIn = Lf_CutTruth(p,pCut0);
    pIn_00 = Lf_CutTruth(p,pCut1);
    uVar2 = Abc_LitIsCompl(pCut0->iFunc);
    Abc_TtCopy(uTruth1 + 0x3f,pIn,nWords_00,uVar2 ^ fCompl0);
    uVar2 = Abc_LitIsCompl(pCut1->iFunc);
    Abc_TtCopy((word *)&truthId,pIn_00,nWords_00,uVar2 ^ fCompl1);
    Abc_TtExpand(uTruth1 + 0x3f,iVar3,(int *)(pCut0 + 1),*(uint *)&pCut0->field_0x14 >> 0x18,
                 (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
    Abc_TtExpand((word *)&truthId,iVar3,(int *)(pCut1 + 1),*(uint *)&pCut1->field_0x14 >> 0x18,
                 (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
    if (fIsXor == 0) {
      local_648 = (uint)uTruth1[0x3f] & truthId & 1;
      Abc_TtAnd(uTruth0 + 0x3f,uTruth1 + 0x3f,(word *)&truthId,nWords_00,local_648);
    }
    else {
      local_648 = ((uint)uTruth1[0x3f] ^ truthId) & 1;
      Abc_TtXor(uTruth0 + 0x3f,uTruth1 + 0x3f,(word *)&truthId,nWords_00,local_648);
    }
    iVar3 = Abc_TtMinBase(uTruth0 + 0x3f,(int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18,
                          iVar3);
    *(uint *)&pCutR->field_0x14 = *(uint *)&pCutR->field_0x14 & 0xffffff | iVar3 << 0x18;
    if ((uTruth0[0x3f] & 1) != 0) {
      __assert_fail("(uTruth[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x3ec,
                    "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                   );
    }
    iVar3 = Vec_MemHashInsert(p->vTtMem,uTruth0 + 0x3f);
    iVar3 = Abc_Var2Lit(iVar3,local_648);
    pCutR->iFunc = iVar3;
    if (uVar1 < *(uint *)&pCutR->field_0x14 >> 0x18) {
      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x3f0,
                    "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                   );
    }
    p_local._4_4_ = (uint)(*(uint *)&pCutR->field_0x14 >> 0x18 < uVar1);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Lf_CutComputeTruth( Lf_Man_t * p, Lf_Cut_t * pCut0, Lf_Cut_t * pCut1, int fCompl0, int fCompl1, Lf_Cut_t * pCutR, int fIsXor )
{
    if ( p->pPars->nLutSize <= 6 )
        return Lf_CutComputeTruth6( p, pCut0, pCut1, fCompl0, fCompl1, pCutR, fIsXor );
    {
    word uTruth[LF_TT_WORDS], uTruth0[LF_TT_WORDS], uTruth1[LF_TT_WORDS];
    int nOldSupp   = pCutR->nLeaves, truthId;
    int LutSize    = p->pPars->nLutSize, fCompl;
    int nWords     = Abc_Truth6WordNum(LutSize);
    word * pTruth0 = Lf_CutTruth(p, pCut0);
    word * pTruth1 = Lf_CutTruth(p, pCut1);
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 );
    Abc_TtExpand( uTruth0, LutSize, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    Abc_TtExpand( uTruth1, LutSize, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    if ( fIsXor )
        Abc_TtXor( uTruth, uTruth0, uTruth1, nWords, (fCompl = (int)((uTruth0[0] ^ uTruth1[0]) & 1)) );
    else
        Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, (fCompl = (int)((uTruth0[0] & uTruth1[0]) & 1)) );
    pCutR->nLeaves = Abc_TtMinBase( uTruth, pCutR->pLeaves, pCutR->nLeaves, LutSize );
    assert( (uTruth[0] & 1) == 0 );
//Kit_DsdPrintFromTruth( uTruth, pCutR->nLeaves ), printf("\n" ), printf("\n" );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
    }
}